

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_energy_matrix.cpp
# Opt level: O0

energy_t __thiscall
s_energy_matrix::compute_internal_restricted
          (s_energy_matrix *this,cand_pos_t i,cand_pos_t j,paramT *params,
          vector<int,_std::allocator<int>_> *up)

{
  int type_2;
  int si1;
  int iVar1;
  int *piVar2;
  reference pvVar3;
  s_energy_matrix *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  int j_00;
  vrna_param_t *unaff_retaddr;
  energy_t v_iloop_kl;
  int l;
  cand_pos_t min_l;
  cand_pos_t k;
  int ptype_closing;
  cand_pos_t max_k;
  energy_t v_iloop;
  cand_pos_t in_stack_ffffffffffffff94;
  s_energy_matrix *this_00;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int sj1;
  int type;
  energy_t eVar4;
  long lVar5;
  
  eVar4 = 10000000;
  type_2 = in_EDX + -5;
  si1 = in_ESI + 0x1f;
  lVar5 = in_RDI;
  piVar2 = std::min<int>((int *)&stack0xffffffffffffffd4,(int *)&stack0xffffffffffffffd0);
  type = *piVar2;
  sj1 = pair[*(short *)(*(long *)(in_RDI + 8) + (long)in_ESI * 2)]
        [*(short *)(*(long *)(in_RDI + 8) + (long)in_EDX * 2)];
  for (local_38 = in_ESI + 1; local_38 <= type; local_38 = local_38 + 1) {
    local_40 = local_38 + 0x24;
    local_44 = (local_38 + in_EDX) - in_ESI;
    piVar2 = std::max<int>(&local_40,&local_44);
    local_3c = *piVar2 + -0x20;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_R8,(long)(local_38 + -1));
    iVar1 = in_EDX;
    if ((local_38 - in_ESI) + -1 <= *pvVar3) {
      while (local_48 = iVar1 + -1, local_3c <= local_48) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_R8,(long)(in_EDX + -1));
        iVar1 = local_48;
        if ((in_EDX - local_48) + -1 <= *pvVar3) {
          j_00 = (int)*(short *)(*(long *)(in_RDI + 0x10) + (long)(local_48 + 1) * 2);
          this_00 = in_RCX;
          iVar1 = E_IntLoop((int)in_R8,eVar4,type,type_2,si1,sj1,in_EDX,(int)lVar5,unaff_retaddr);
          eVar4 = get_energy(this_00,in_stack_ffffffffffffff94,j_00);
          local_4c = iVar1 + eVar4;
          piVar2 = std::min<int>((int *)&stack0xffffffffffffffdc,&local_4c);
          eVar4 = *piVar2;
          iVar1 = local_48;
        }
      }
    }
  }
  return eVar4;
}

Assistant:

energy_t s_energy_matrix::compute_internal_restricted(cand_pos_t i, cand_pos_t j, const paramT *params, std::vector<int> &up){
	energy_t v_iloop = INF;
	cand_pos_t max_k = std::min(j-TURN-2,i+MAXLOOP+1);
	const int ptype_closing = pair[S_[i]][S_[j]];
	for ( cand_pos_t k=i+1; k<=max_k; ++k) {
		
		cand_pos_t min_l=std::max(k+TURN+1 + MAXLOOP+2, k+j-i) - MAXLOOP-2;
        if((up[k-1]>=(k-i-1))){
            for (int l=j-1; l>=min_l; --l) {
                if(up[j-1]>=(j-l-1)){
                    energy_t v_iloop_kl = E_IntLoop(k-i-1,j-l-1,ptype_closing,rtype[pair[S_[k]][S_[l]]],S1_[i+1],S1_[j-1],S1_[k-1],S1_[l+1],const_cast<paramT *>(params)) + get_energy(k,l);
                    v_iloop = std::min(v_iloop,v_iloop_kl);
                }
            }
        }
	}
	return v_iloop;
}